

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

string * clask::url_encode(string *__return_storage_ptr__,string *value,bool escape_slash)

{
  byte *pbVar1;
  uint *puVar2;
  byte bVar3;
  long lVar4;
  size_type sVar5;
  pointer pcVar6;
  string *psVar7;
  int iVar8;
  ostream *this;
  undefined7 in_register_00000011;
  size_type sVar9;
  ostringstream os;
  byte abStack_1b8 [3];
  byte local_1b5;
  undefined4 local_1b4;
  string *local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1b4 = (undefined4)CONCAT71(in_register_00000011,escape_slash);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar4 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar4 + 1] == '\0') {
    std::ios::widen((char)abStack_1b8 + (char)lVar4 + '\x10');
    acStack_c8[lVar4 + 1] = '\x01';
  }
  acStack_c8[lVar4] = '0';
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  sVar5 = value->_M_string_length;
  local_1b0 = __return_storage_ptr__;
  if (sVar5 != 0) {
    pcVar6 = (value->_M_dataplus)._M_p;
    sVar9 = 0;
    pbVar1 = abStack_1b8 + 3;
    do {
      bVar3 = pcVar6[sVar9];
      iVar8 = isalnum((int)(char)bVar3);
      if ((((iVar8 == 0) && (1 < bVar3 - 0x2d)) && (bVar3 != 0x7e)) && (bVar3 != 0x5f)) {
        if (bVar3 == 0x2f && (char)local_1b4 == '\0') {
          local_1b5 = 0x2f;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)pbVar1,1);
        }
        else {
          puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
          *puVar2 = *puVar2 | 0x4000;
          local_1b5 = 0x25;
          this = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)pbVar1,1);
          *(undefined8 *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = 2;
          std::ostream::operator<<(this,(uint)bVar3);
          puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
          *puVar2 = *puVar2 & 0xffffbfff;
        }
      }
      else {
        local_1b5 = bVar3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)pbVar1,1);
      }
      sVar9 = sVar9 + 1;
    } while (sVar5 != sVar9);
  }
  psVar7 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

inline std::string url_encode(const std::string &value, bool escape_slash = true) {
  std::ostringstream os;
  os.fill('0');
  os << std::hex;
  for (char c : value) {
    if (isalnum(c) || c == '-' || c == '_' || c == '.' || c == '~') {
      os << c;
      continue;
    }
    if (!escape_slash && c == '/') {
      os << c;
      continue;
    }
    os << std::uppercase;
    os << '%' << std::setw(2) << int((unsigned char) c);
    os << std::nouppercase;
  }
  return os.str();
}